

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateEnum
          (Generator *this,GeneratorOptions *options,Printer *printer,EnumDescriptor *enumdesc)

{
  char cVar1;
  long lVar2;
  pointer piVar3;
  int iVar4;
  char *pcVar5;
  byte bVar6;
  EnumValueDescriptor *descriptor;
  Descriptor *in_R8;
  pointer piVar7;
  long lVar8;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  vector<int,_std::allocator<int>_> valid_index;
  char *local_f8;
  undefined8 local_f0;
  long local_e8;
  char local_e0 [32];
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  used_name;
  string local_50;
  
  (anonymous_namespace)::GetPrefix_abi_cxx11_
            ((string *)&used_name,(_anonymous_namespace_ *)options,
             *(GeneratorOptions **)(enumdesc + 0x10),*(FileDescriptor **)(enumdesc + 0x18),in_R8);
  io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,"/**\n * @enum {number}\n */\n$enumprefix$$name$ = {\n",
             (char (*) [11])"enumprefix",(string *)&used_name,(char (*) [5])0x3f58c9,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(enumdesc + 8));
  if ((_Base_ptr *)used_name._M_t._M_impl._0_8_ !=
      &used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)used_name._M_t._M_impl._0_8_);
  }
  io::Printer::Annotate<google::protobuf::EnumDescriptor>(printer,"name","name",enumdesc);
  used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &used_name._M_t._M_impl.super__Rb_tree_header._M_header;
  iVar4 = 0;
  used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  used_name._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f0 = (char *)((ulong)local_f0._4_4_ << 0x20);
  used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(enumdesc + 4)) {
    do {
      cVar1 = *(char *)(*(long *)(enumdesc + 0x20) + 0x48);
      if (cVar1 == '\x01') {
        anon_unknown_0::ToEnumCase
                  (&local_50,*(string **)(*(long *)(enumdesc + 0x28) + 8 + (long)iVar4 * 0x20));
        pVar9 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&used_name,&local_50);
        bVar6 = pVar9.second ^ 1;
      }
      else {
        bVar6 = 0;
      }
      if ((cVar1 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((bVar6 & 1) == 0) {
        if (valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&valid_index,
                     (iterator)
                     valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_f0);
        }
        else {
          *valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish = (int)local_f0;
          valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      iVar4 = (int)local_f0 + 1;
      local_f0 = (char *)CONCAT44(local_f0._4_4_,iVar4);
    } while (iVar4 < *(int *)(enumdesc + 4));
  }
  piVar3 = valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar7 = valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar4 = *piVar7;
      lVar2 = *(long *)(enumdesc + 0x28);
      lVar8 = (long)iVar4 * 0x20;
      anon_unknown_0::ToEnumCase(&local_c0,*(string **)(lVar2 + 8 + lVar8));
      descriptor = (EnumValueDescriptor *)(lVar2 + lVar8);
      local_f0 = local_e0;
      pcVar5 = FastInt32ToBufferLeft(*(int32 *)(descriptor + 4),local_e0);
      local_e8 = (long)pcVar5 - (long)local_e0;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,local_f0,local_f0 + local_e8);
      local_f8 = ",";
      if (iVar4 == valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1]) {
        local_f8 = "";
      }
      io::Printer::
      Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string,char[6],char_const*>
                (printer,"  $name$: $value$$comma$\n",(char (*) [5])0x3f58c9,&local_c0,
                 (char (*) [6])0x43fa60,&local_a0,(char (*) [6])"comma",&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      io::Printer::Annotate<google::protobuf::EnumValueDescriptor>(printer,"name","name",descriptor)
      ;
      piVar7 = piVar7 + 1;
    } while (piVar7 != piVar3);
  }
  io::Printer::Print<>(printer,"};\n\n");
  if (valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&used_name._M_t);
  return;
}

Assistant:

void Generator::GenerateEnum(const GeneratorOptions& options,
                             io::Printer* printer,
                             const EnumDescriptor* enumdesc) const {
  printer->Print(
      "/**\n"
      " * @enum {number}\n"
      " */\n"
      "$enumprefix$$name$ = {\n",
      "enumprefix", GetEnumPathPrefix(options, enumdesc), "name",
      enumdesc->name());
  printer->Annotate("name", enumdesc);

  std::set<std::string> used_name;
  std::vector<int> valid_index;
  for (int i = 0; i < enumdesc->value_count(); i++) {
    if (enumdesc->options().allow_alias() &&
        !used_name.insert(ToEnumCase(enumdesc->value(i)->name())).second) {
      continue;
    }
    valid_index.push_back(i);
  }
  for (auto i : valid_index) {
    const EnumValueDescriptor* value = enumdesc->value(i);
    printer->Print("  $name$: $value$$comma$\n", "name",
                   ToEnumCase(value->name()), "value", StrCat(value->number()),
                   "comma", (i == valid_index.back()) ? "" : ",");
    printer->Annotate("name", value);
  }

  printer->Print(
      "};\n"
      "\n");
}